

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

vector<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
* __thiscall
wallet::CWallet::ListAddrBookAddresses
          (vector<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
           *__return_storage_ptr__,CWallet *this,optional<wallet::CWallet::AddrBookFilter> *_filter)

{
  long lVar1;
  long in_FS_OFFSET;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  long *local_58;
  undefined8 uStack_50;
  long local_48 [2];
  ulong local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((_filter->super__Optional_base<wallet::CWallet::AddrBookFilter,_false,_false>)._M_payload.
      super__Optional_payload<wallet::CWallet::AddrBookFilter,_true,_false,_false>.
      super__Optional_payload_base<wallet::CWallet::AddrBookFilter>._M_engaged == true) {
    local_38 = local_38 & 0xffffffffffffff00;
    if (*(char *)((long)&(_filter->
                         super__Optional_base<wallet::CWallet::AddrBookFilter,_false,_false>).
                         _M_payload.
                         super__Optional_payload<wallet::CWallet::AddrBookFilter,_true,_false,_false>
                         .super__Optional_payload_base<wallet::CWallet::AddrBookFilter>._M_payload +
                 0x20) == '\x01') {
      local_58 = local_48;
      lVar1 = *(long *)&(_filter->
                        super__Optional_base<wallet::CWallet::AddrBookFilter,_false,_false>).
                        _M_payload.
                        super__Optional_payload<wallet::CWallet::AddrBookFilter,_true,_false,_false>
                        .super__Optional_payload_base<wallet::CWallet::AddrBookFilter>._M_payload;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,lVar1,
                 *(long *)((long)&(_filter->
                                  super__Optional_base<wallet::CWallet::AddrBookFilter,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<wallet::CWallet::AddrBookFilter,_true,_false,_false>
                                  .super__Optional_payload_base<wallet::CWallet::AddrBookFilter>.
                                  _M_payload + 8) + lVar1);
      local_38 = CONCAT71(local_38._1_7_,1);
    }
    uStack_30 = CONCAT71(uStack_30._1_7_,
                         (_filter->
                         super__Optional_base<wallet::CWallet::AddrBookFilter,_false,_false>).
                         _M_payload.
                         super__Optional_payload<wallet::CWallet::AddrBookFilter,_true,_false,_false>
                         .super__Optional_payload_base<wallet::CWallet::AddrBookFilter>._M_payload.
                         _M_value.ignore_change);
  }
  else {
    local_38 = 0;
    local_48[0] = 0;
    local_48[1] = 0;
    local_58 = (long *)0x0;
    uStack_50 = 0;
    uStack_30 = 1;
  }
  local_78._8_8_ = &local_58;
  local_60 = std::
             _Function_handler<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_std::optional<wallet::AddressPurpose>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:2624:26)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_std::optional<wallet::AddressPurpose>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:2624:26)>
             ::_M_manager;
  local_78._M_unused._M_object = __return_storage_ptr__;
  ForEachAddrBookEntry(this,(ListAddrBookFunc *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((char)local_38 == '\x01') {
    local_38 = local_38 & 0xffffffffffffff00;
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CTxDestination> CWallet::ListAddrBookAddresses(const std::optional<AddrBookFilter>& _filter) const
{
    AssertLockHeld(cs_wallet);
    std::vector<CTxDestination> result;
    AddrBookFilter filter = _filter ? *_filter : AddrBookFilter();
    ForEachAddrBookEntry([&result, &filter](const CTxDestination& dest, const std::string& label, bool is_change, const std::optional<AddressPurpose>& purpose) {
        // Filter by change
        if (filter.ignore_change && is_change) return;
        // Filter by label
        if (filter.m_op_label && *filter.m_op_label != label) return;
        // All good
        result.emplace_back(dest);
    });
    return result;
}